

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_image<unsigned_char,unsigned_char>
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int c0,CImg<unsigned_char> *sprite,
          CImg<unsigned_char> *mask,float opacity,float mask_max_value)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  uchar *puVar5;
  uchar *puVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  CImgArgumentException *this_00;
  int iVar12;
  byte *pbVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  char *pcVar28;
  int iVar29;
  uint uVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  float fVar34;
  float fVar35;
  ulong local_c0;
  CImg<unsigned_char> local_70 [2];
  
  puVar4 = this->_data;
  uVar9 = this->_width;
  uVar30 = this->_height;
  uVar10 = this->_depth;
  uVar25 = this->_spectrum;
  if (((uVar25 != 0 && ((uVar10 != 0 && uVar30 != 0) && (uVar9 != 0 && puVar4 != (uchar *)0x0))) &&
      (puVar5 = sprite->_data, puVar5 != (uchar *)0x0)) &&
     (puVar6 = mask->_data, puVar6 != (uchar *)0x0)) {
    uVar11 = sprite->_width;
    uVar22 = sprite->_height;
    uVar33 = sprite->_depth;
    uVar20 = sprite->_spectrum;
    if ((puVar5 < puVar4 + (ulong)uVar10 * (ulong)uVar25 * (ulong)uVar30 * (ulong)uVar9) &&
       (puVar4 < puVar5 + (ulong)uVar33 * (ulong)uVar20 * (ulong)uVar22 * (ulong)uVar11)) {
      CImg(local_70,sprite,false);
      this = draw_image<unsigned_char,unsigned_char>
                       (this,x0,y0,z0,c0,local_70,mask,opacity,mask_max_value);
    }
    else {
      uVar17 = (ulong)mask->_spectrum * (ulong)mask->_depth *
               (ulong)mask->_height * (ulong)mask->_width;
      if ((puVar4 + (ulong)uVar10 * (ulong)uVar25 * (ulong)uVar30 * (ulong)uVar9 <= puVar6) ||
         (puVar6 + uVar17 <= puVar4)) {
        if (((mask->_width != uVar11) || (mask->_height != uVar22)) || (mask->_depth != uVar33)) {
          this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
          pcVar28 = "non-";
          if (this->_is_shared != false) {
            pcVar28 = "";
          }
          CImgArgumentException::CImgArgumentException
                    (this_00,
                     "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::draw_image(): Sprite (%u,%u,%u,%u,%p) and mask (%u,%u,%u,%u,%p) have incompatible dimensions."
                     ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                     (ulong)this->_spectrum,this->_data,pcVar28,"unsigned char",
                     (ulong)sprite->_width,(ulong)sprite->_height,(ulong)sprite->_depth,
                     (ulong)sprite->_spectrum,sprite->_data,(ulong)mask->_width,(ulong)mask->_height
                     ,(ulong)mask->_depth,(ulong)mask->_spectrum,mask->_data);
          __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
        }
        uVar26 = 0;
        if (0 < x0) {
          uVar26 = x0;
        }
        uVar19 = 0;
        if (0 < y0) {
          uVar19 = y0;
        }
        uVar8 = 0;
        if (0 < z0) {
          uVar8 = z0;
        }
        uVar32 = 0;
        if (0 < c0) {
          uVar32 = c0;
        }
        uVar27 = uVar26 - x0;
        iVar12 = uVar9 - (uVar11 + x0);
        if ((int)(uVar11 + x0) <= (int)uVar9) {
          iVar12 = 0;
        }
        iVar12 = iVar12 + (uVar11 - uVar27);
        iVar29 = uVar30 - (uVar22 + y0);
        if ((int)(uVar22 + y0) <= (int)uVar30) {
          iVar29 = 0;
        }
        iVar24 = uVar10 - (uVar33 + z0);
        if ((int)(uVar33 + z0) <= (int)uVar10) {
          iVar24 = 0;
        }
        iVar21 = uVar25 - (uVar20 + c0);
        if ((int)(uVar20 + c0) <= (int)uVar25) {
          iVar21 = 0;
        }
        if (iVar12 < 1) {
          return this;
        }
        uVar9 = uVar19 - y0;
        uVar30 = iVar29 + (uVar22 - uVar9);
        if ((int)uVar30 < 1) {
          return this;
        }
        uVar10 = uVar8 - z0;
        uVar25 = iVar24 + (uVar33 - uVar10);
        if ((int)uVar25 < 1) {
          return this;
        }
        uVar11 = uVar32 - c0;
        uVar22 = iVar21 + (uVar20 - uVar11);
        if ((int)uVar22 < 1) {
          return this;
        }
        local_c0 = (ulong)uVar32;
        uVar15 = 0;
        uVar33 = uVar11;
        do {
          uVar14 = 0;
          uVar18 = (ulong)uVar8;
          uVar20 = uVar10;
          do {
            uVar16 = 0;
            uVar31 = (ulong)uVar19;
            uVar32 = uVar9;
            do {
              pbVar13 = mask->_data +
                        ((ulong)mask->_width *
                         ((long)(int)(uVar9 + (int)uVar16) +
                         (ulong)mask->_height *
                         ((ulong)mask->_depth * (long)(int)(uVar11 + (int)uVar15) +
                         (long)(int)(uVar10 + (int)uVar14))) + (long)(int)uVar27) % uVar17;
              uVar1 = sprite->_height;
              uVar2 = sprite->_depth;
              uVar3 = sprite->_width;
              puVar4 = sprite->_data;
              puVar5 = this->_data;
              lVar7 = ((this->_depth * local_c0 + uVar18) * (ulong)this->_height + uVar31) *
                      (ulong)this->_width + (ulong)uVar26;
              lVar23 = 0;
              do {
                fVar35 = (float)*pbVar13 * opacity;
                fVar34 = 0.0;
                if (0.0 <= fVar35) {
                  fVar34 = fVar35;
                }
                pbVar13 = pbVar13 + 1;
                puVar5[lVar23 + lVar7] =
                     (uchar)(int)(((float)puVar4[lVar23 + (((ulong)uVar2 * (ulong)uVar33 +
                                                           (ulong)uVar20) * (ulong)uVar1 +
                                                          (ulong)uVar32) * (ulong)uVar3 +
                                                          (ulong)uVar27] * ABS(fVar35) +
                                  (float)puVar5[lVar23 + lVar7] * (mask_max_value - fVar34)) /
                                 mask_max_value);
                lVar23 = lVar23 + 1;
              } while ((int)lVar23 < iVar12);
              uVar16 = uVar16 + 1;
              uVar32 = uVar32 + 1;
              uVar31 = uVar31 + 1;
            } while (uVar16 < uVar30);
            uVar14 = uVar14 + 1;
            uVar20 = uVar20 + 1;
            uVar18 = uVar18 + 1;
          } while (uVar14 < uVar25);
          uVar15 = uVar15 + 1;
          uVar33 = uVar33 + 1;
          local_c0 = local_c0 + 1;
        } while (uVar15 < uVar22);
        return this;
      }
      CImg(local_70,mask,false);
      this = draw_image<unsigned_char,unsigned_char>
                       (this,x0,y0,z0,c0,sprite,local_70,opacity,mask_max_value);
    }
    if ((local_70[0]._is_shared == false) && (local_70[0]._data != (uchar *)0x0)) {
      operator_delete__(local_70[0]._data);
    }
  }
  return this;
}

Assistant:

CImg<T>& draw_image(const int x0, const int y0, const int z0, const int c0,
                        const CImg<ti>& sprite, const CImg<tm>& mask, const float opacity=1,
                        const float mask_max_value=1) {
      if (is_empty() || !sprite || !mask) return *this;
      if (is_overlapped(sprite)) return draw_image(x0,y0,z0,c0,+sprite,mask,opacity,mask_max_value);
      if (is_overlapped(mask)) return draw_image(x0,y0,z0,c0,sprite,+mask,opacity,mask_max_value);
      if (mask._width!=sprite._width || mask._height!=sprite._height || mask._depth!=sprite._depth)
        throw CImgArgumentException(_cimg_instance
                                    "draw_image(): Sprite (%u,%u,%u,%u,%p) and mask (%u,%u,%u,%u,%p) have "
                                    "incompatible dimensions.",
                                    cimg_instance,
                                    sprite._width,sprite._height,sprite._depth,sprite._spectrum,sprite._data,
                                    mask._width,mask._height,mask._depth,mask._spectrum,mask._data);

      const bool bx = x0<0, by = y0<0, bz = z0<0, bc = c0<0;
      const int
        dx0 = bx?0:x0, dy0 = by?0:y0, dz0 = bz?0:z0, dc0 = bc?0:c0,
        sx0 = dx0 - x0,  sy0 = dy0 - y0, sz0 = dz0 - z0, sc0 = dc0 - c0,
        lx = sprite.width() - sx0 - (x0 + sprite.width()>width()?x0 + sprite.width() - width():0),
        ly = sprite.height() - sy0 - (y0 + sprite.height()>height()?y0 + sprite.height() - height():0),
        lz = sprite.depth() - sz0 - (z0 + sprite.depth()>depth()?z0 + sprite.depth() - depth():0),
        lc = sprite.spectrum() - sc0 - (c0 + sprite.spectrum()>spectrum()?c0 + sprite.spectrum() - spectrum():0);
      const ulongT msize = mask.size();

      if (lx>0 && ly>0 && lz>0 && lc>0) {
        for (int c = 0; c<lc; ++c)
          for (int z = 0; z<lz; ++z)
            for (int y = 0; y<ly; ++y) {
              T *ptrd = data(dx0,dy0 + y,dz0 + z,dc0 + c);
              const ti *ptrs = sprite.data(sx0,sy0 + y,sz0 + z,sc0 + c);
              const tm *ptrm = mask._data + (mask.offset(sx0,sy0 + y,sz0 + z,sc0 + c)%msize);
              for (int x = 0; x<lx; ++x) {
                const float mopacity = (float)(*(ptrm++)*opacity),
                  nopacity = cimg::abs(mopacity), copacity = mask_max_value - std::max(mopacity,0.f);
                *ptrd = (T)((nopacity*(*(ptrs++)) + *ptrd*copacity)/mask_max_value);
                ++ptrd;
              }
            }
      }
      return *this;
    }